

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_slt_8_aw(void)

{
  uint uVar1;
  uint value;
  
  uVar1 = m68ki_read_imm_16();
  value = 0;
  if (((m68ki_cpu.n_flag ^ m68ki_cpu.v_flag) & 0x80) != 0) {
    value = 0xff;
  }
  m68ki_write_8_fc((int)(short)uVar1,m68ki_cpu.s_flag | 1,value);
  return;
}

Assistant:

static void m68k_op_slt_8_aw(void)
{
	m68ki_write_8(EA_AW_8(), COND_LT() ? 0xff : 0);
}